

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_gmv.c
# Opt level: O2

void iep2_update_gmv(iep2_api_ctx *ctx,mv_list *mv_ls)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *__ptr;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int map [56];
  
  uVar1 = (ctx->params).tile_cols;
  uVar2 = (ctx->params).tile_rows;
  for (lVar13 = 0; lVar13 != 0x38; lVar13 = lVar13 + 1) {
    if (((ctx->output).mv_hist[lVar13] != 0) && (((byte)iep_debug & 2) != 0)) {
      _mpp_log_l(4,"iep2","iep:mv(%d) %d\n",(char *)0x0,(ulong)((int)lVar13 - 0x1c));
    }
  }
  (ctx->output).mv_hist[0x1c] = 0;
  __ptr = malloc(0xe0);
  for (lVar13 = 0; lVar13 != 0x38; lVar13 = lVar13 + 1) {
    map[lVar13] = (int)lVar13;
    *(uint32_t *)((long)__ptr + lVar13 * 4) = (ctx->output).mv_hist[lVar13];
  }
  uVar7 = 1;
  for (uVar8 = 0; uVar8 != 0x38; uVar8 = uVar8 + 1) {
    uVar11 = uVar8 & 0xffffffff;
    for (uVar10 = uVar7; lVar13 = (long)(int)uVar11, uVar10 != 0x38; uVar10 = uVar10 + 1) {
      uVar6 = uVar10 & 0xffffffff;
      if (*(uint *)((long)__ptr + uVar10 * 4) <= *(uint *)((long)__ptr + lVar13 * 4)) {
        uVar6 = uVar11;
      }
      uVar11 = uVar6;
    }
    uVar3 = *(undefined4 *)((long)__ptr + uVar8 * 4);
    iVar4 = map[uVar8];
    map[uVar8] = map[lVar13];
    *(undefined4 *)((long)__ptr + uVar8 * 4) = *(undefined4 *)((long)__ptr + lVar13 * 4);
    map[lVar13] = iVar4;
    *(undefined4 *)((long)__ptr + lVar13 * 4) = uVar3;
    uVar7 = uVar7 + 1;
  }
  free(__ptr);
  if (((byte)iep_debug & 2) != 0) {
    _mpp_log_l(4,"iep2","iep:sort map:\n",(char *)0x0);
  }
  (ctx->params).mv_tru_vld[6] = 0;
  (ctx->params).mv_tru_vld[7] = 0;
  (ctx->params).mv_tru_vld[2] = 0;
  (ctx->params).mv_tru_vld[3] = 0;
  (ctx->params).mv_tru_vld[4] = 0;
  (ctx->params).mv_tru_vld[5] = 0;
  (ctx->params).mv_tru_list[0] = '\0';
  (ctx->params).mv_tru_list[1] = '\0';
  (ctx->params).mv_tru_list[2] = '\0';
  (ctx->params).mv_tru_list[3] = '\0';
  (ctx->params).mv_tru_list[4] = '\0';
  (ctx->params).mv_tru_list[5] = '\0';
  (ctx->params).mv_tru_list[6] = '\0';
  (ctx->params).mv_tru_list[7] = '\0';
  (ctx->params).mv_tru_vld[0] = 0;
  (ctx->params).mv_tru_vld[1] = 0;
  lVar13 = 0;
  do {
    if (lVar13 == 8) {
LAB_0017990b:
      for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
        if (((byte)iep_debug & 2) != 0) {
          _mpp_log_l(4,"iep2","iep:new mv candidates list[%d] (%d,%d) %d\n",(char *)0x0,
                     uVar7 & 0xffffffff,(ulong)(uint)(int)(ctx->params).mv_tru_list[uVar7],0,
                     (ulong)(ctx->params).mv_tru_vld[uVar7]);
        }
      }
      return;
    }
    cVar9 = (char)map[lVar13] + -0x1c;
    if ((ctx->output).mv_hist[map[lVar13]] <= (uint)(((int)(uVar1 * uVar2) >> 7) * 6)) {
      uVar7 = (ulong)(uint)mv_ls->idx;
      if (mv_ls->idx < 1) {
        uVar7 = 0;
      }
      uVar8 = 0;
      do {
        if (uVar7 == uVar8) {
          if (lVar13 == 0) {
            (ctx->params).mv_tru_list[0] = '\0';
            (ctx->params).mv_tru_vld[0] = 1;
          }
          goto LAB_0017990b;
        }
        uVar12 = mv_ls->mv[uVar8] + cVar9 * -4;
        uVar5 = -uVar12;
        if (0 < (int)uVar12) {
          uVar5 = uVar12;
        }
        uVar8 = uVar8 + 1;
      } while (2 < uVar5);
    }
    (ctx->params).mv_tru_list[lVar13] = cVar9;
    (ctx->params).mv_tru_vld[lVar13] = 1;
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void iep2_update_gmv(struct iep2_api_ctx *ctx, struct mv_list *mv_ls)
{
    int rows = ctx->params.tile_rows;
    int cols = ctx->params.tile_cols;
    uint32_t *bin = ctx->output.mv_hist;
    int lbin = MPP_ARRAY_ELEMS(ctx->output.mv_hist);
    int i;

    int map[MPP_ARRAY_ELEMS(ctx->output.mv_hist)];

    uint32_t r = 6;

    // print mvc histogram of current motion estimation.
    for (i = 0; i < lbin; ++i) {
        if (bin[i] == 0)
            continue;
        iep_dbg_trace("mv(%d) %d\n", i - MVL, bin[i]);
    }

    bin[MVL] = 0; // disable 0 mv

    // update motion vector candidates
    iep2_sort(bin, map, lbin);

    iep_dbg_trace("sort map:\n");
    if (0) {
        for (i = 0; i < lbin; ++i) {
            fprintf(stderr, "%d ", map[i]);
        }
        fprintf(stderr, "\n");
    }

    memset(ctx->params.mv_tru_list, 0, sizeof(ctx->params.mv_tru_list));
    memset(ctx->params.mv_tru_vld, 0, sizeof(ctx->params.mv_tru_vld));

    // Get top 8 candidates of current motion estimation.
    for (i = 0; i < 8; ++i) {
        int8_t x = map[i] - MVL;

        if (bin[map[i]] > r * ((rows * cols) >> 7) ||
            iep2_is_subt_mv(x, mv_ls)) {

            // 1 bit at low endian for mv valid check
            ctx->params.mv_tru_list[i] = x;
            ctx->params.mv_tru_vld[i] = 1;
        } else {
            if (i == 0) {
                ctx->params.mv_tru_list[0] = 0;
                ctx->params.mv_tru_vld[0] = 1;
            }
            break;
        }
    }

    for (i = 0; i < 8; ++i)
        iep_dbg_trace("new mv candidates list[%d] (%d,%d) %d\n",
                      i, ctx->params.mv_tru_list[i], 0, ctx->params.mv_tru_vld[i]);
}